

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ShaderBuiltinConstantCase<int>::init
          (ShaderBuiltinConstantCase<int> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  NotSupportedError *pNVar4;
  string *psVar5;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined7 extraout_var_01;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  psVar5 = &this->m_requiredExt;
  bVar2 = std::operator==(psVar5,"GL_OES_sample_variables");
  iVar3 = (int)CONCAT71(extraout_var,bVar2);
  if (!bVar2) {
    bVar2 = std::operator==(psVar5,"GL_EXT_geometry_shader");
    iVar3 = (int)CONCAT71(extraout_var_00,bVar2);
    if (!bVar2) {
      bVar2 = std::operator==(psVar5,"GL_EXT_tessellation_shader");
      iVar3 = (int)CONCAT71(extraout_var_01,bVar2);
      if (!bVar2) {
        if ((this->m_requiredExt)._M_string_length != 0) {
          bVar2 = glu::ContextInfo::isExtensionSupported
                            (((this->super_TestCase).m_context)->m_contextInfo,
                             (this->m_requiredExt)._M_dataplus._M_p);
          iVar3 = (int)CONCAT71(extraout_var_03,bVar2);
          if (!bVar2) {
            pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            std::operator+(&message,psVar5," not supported");
            tcu::NotSupportedError::NotSupportedError(pNVar4,&message);
            __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
        }
        if (bVar1) {
          return iVar3;
        }
        goto LAB_0138662b;
      }
    }
  }
  if (bVar1) {
    return iVar3;
  }
  std::operator+(&local_40,"The test requires a 3.2 context or support for the extension ",psVar5);
  std::operator+(&message,&local_40,".");
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     (this->m_requiredExt)._M_dataplus._M_p);
  if (!bVar1) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,message._M_dataplus._M_p,
               "m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str())",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
               ,0xa8);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::~string((string *)&message);
LAB_0138662b:
  psVar5 = &this->m_varName;
  bVar1 = std::operator==(psVar5,"gl_MaxTessControlImageUniforms");
  if ((((!bVar1) && (bVar1 = std::operator==(psVar5,"gl_MaxTessEvaluationImageUniforms"), !bVar1))
      && (bVar1 = std::operator==(psVar5,"gl_MaxTessControlAtomicCounters"), !bVar1)) &&
     ((bVar1 = std::operator==(psVar5,"gl_MaxTessEvaluationAtomicCounters"), !bVar1 &&
      (bVar1 = std::operator==(psVar5,"gl_MaxTessControlAtomicCounterBuffers"), !bVar1)))) {
    bVar1 = std::operator==(psVar5,"gl_MaxTessEvaluationAtomicCounterBuffers");
    if (!bVar1) {
      return (int)CONCAT71(extraout_var_02,bVar1);
    }
  }
  std::operator+(&local_40,"The test requires a 3.2 context. The constant \'",psVar5);
  std::operator+(&message,&local_40,"\' is not supported.");
  std::__cxx11::string::~string((string *)&local_40);
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar4,message._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderBuiltinConstantTests.cpp"
             ,0xb6);
  __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderBuiltinConstantCase<DataType>::init (void)
{
	const bool supportsES32 = contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (m_requiredExt == "GL_OES_sample_variables" || m_requiredExt == "GL_EXT_geometry_shader" || m_requiredExt == "GL_EXT_tessellation_shader")
	{
		if(!supportsES32)
		{
			const std::string message = "The test requires a 3.2 context or support for the extension " + m_requiredExt + ".";
			TCU_CHECK_AND_THROW(NotSupportedError, m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str()), message.c_str());
		}
	}
	else if (!m_requiredExt.empty() && !m_context.getContextInfo().isExtensionSupported(m_requiredExt.c_str()))
			throw tcu::NotSupportedError(m_requiredExt + " not supported");

	if (!supportsES32 && (m_varName == "gl_MaxTessControlImageUniforms"	||
		m_varName == "gl_MaxTessEvaluationImageUniforms"			||
		m_varName == "gl_MaxTessControlAtomicCounters"				||
		m_varName == "gl_MaxTessEvaluationAtomicCounters"			||
		m_varName == "gl_MaxTessControlAtomicCounterBuffers"		||
		m_varName == "gl_MaxTessEvaluationAtomicCounterBuffers"))
	{
		std::string message = "The test requires a 3.2 context. The constant '" + m_varName + "' is not supported.";
		TCU_THROW(NotSupportedError, message.c_str());
	}
}